

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockaddr.c
# Opt level: O0

char * nni_inet_ntop(uint8_t *addr,char *buf)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__format;
  byte local_3a;
  int local_38;
  uint8_t i_1;
  _Bool sep;
  int idx;
  uint8_t i;
  uint8_t maxcnt;
  uint8_t maxoff;
  uint8_t cnt;
  undefined8 uStack_2c;
  uint8_t off;
  uint8_t v4map [12];
  char *buf_local;
  uint8_t *addr_local;
  
  uStack_2c = 0;
  v4map[0] = '\0';
  v4map[1] = '\0';
  v4map[2] = 0xff;
  v4map[3] = 0xff;
  v4map._4_8_ = buf;
  iVar2 = memcmp(addr,&stack0xffffffffffffffd4,0xc);
  if (iVar2 == 0) {
    snprintf((char *)v4map._4_8_,0x2e,"::ffff:%u.%u.%u.%u",(ulong)addr[0xc],(ulong)addr[0xd],
             (ulong)addr[0xe],(uint)addr[0xf]);
    addr_local = (uint8_t *)v4map._4_8_;
  }
  else {
    idx._3_1_ = 0;
    idx._2_1_ = 0;
    idx._1_1_ = 0;
    idx._0_1_ = 0;
    for (sep = false; sep < 0x10; sep = (_Bool)(sep + '\x02')) {
      if ((addr[sep] == '\0') && (addr[(int)(sep + 1)] == '\0')) {
        idx._2_1_ = idx._2_1_ + 2;
        if (idx._2_1_ == 2) {
          idx._3_1_ = sep;
        }
        if ((byte)idx < idx._2_1_) {
          idx._1_1_ = idx._3_1_;
          idx._0_1_ = idx._2_1_;
        }
      }
      else {
        idx._2_1_ = 0;
      }
    }
    if ((byte)idx < 2) {
      idx._1_1_ = 0xff;
    }
    local_38 = 0;
    bVar1 = false;
    *(undefined1 *)v4map._4_8_ = 0;
    for (local_3a = 0; local_3a < 0x10; local_3a = local_3a + 2) {
      if (local_3a == idx._1_1_) {
        if (0x2b < local_38) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockaddr.c"
                    ,0x55,"idx <= 43");
        }
        strcat((char *)(v4map._4_8_ + (long)local_38),"::");
        local_38 = local_38 + 2;
        bVar1 = false;
      }
      else if ((local_3a < idx._1_1_) || ((uint)idx._1_1_ + (uint)(byte)idx <= (uint)local_3a)) {
        if (0x28 < local_38) {
          nni_panic("%s: %d: assert err: %s",
                    "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sockaddr.c"
                    ,0x5c,"idx <= 40");
        }
        __format = "%x";
        if (bVar1) {
          __format = ":%x";
        }
        snprintf((char *)(v4map._4_8_ + (long)local_38),6,__format,
                 (ulong)((uint)addr[local_3a] * 0x100 + (uint)addr[(int)(local_3a + 1)]));
        sVar3 = strlen((char *)(v4map._4_8_ + (long)local_38));
        local_38 = local_38 + (int)sVar3;
        bVar1 = true;
      }
    }
    addr_local = (uint8_t *)v4map._4_8_;
  }
  return (char *)addr_local;
}

Assistant:

static char *
nni_inet_ntop(const uint8_t addr[16], char buf[46])
{

	const uint8_t v4map[12] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0xff };

	if (memcmp(addr, v4map, 12) == 0) {
		snprintf(buf, 46, "::ffff:%u.%u.%u.%u", addr[12], addr[13],
		    addr[14], addr[15]);
		return (buf);
	}

	uint8_t off    = 0; // offset of first set of elided zeros
	uint8_t cnt    = 0; // how many elided zeros so far
	uint8_t maxoff = 0; // offset of largest compressed region
	uint8_t maxcnt = 0; // how many elided zeros at maxoff

	// look for the largest compressible region
	for (uint8_t i = 0; i < 16; i += 2) {
		// is this word zero?
		if ((addr[i] == 0) && (addr[i + 1] == 0)) {
			cnt += 2;
			// if this was the first zero word in region, record it
			if (cnt == 2) {
				off = i;
			}
			// possibly update the maximums
			if (cnt > maxcnt) {
				maxcnt = cnt;
				maxoff = off;
			}
		} else {
			cnt = 0;
		}
	}
	if (maxcnt < 2) {
		maxoff = 0xff; // too big for anything
	}

	int  idx = 0;
	bool sep = false;
	buf[0]   = 0;
	for (uint8_t i = 0; i < 16; i += 2) {
		// We have 46 bytes allocated, which is a "theoretical"
		// maximum only.  In practice the worst case is really
		// 8 groups of four digits with 7 colons, so 39 bytes plus
		// the null is 40 bytes.  We only use the v4 mapped syntax
		// when presented with ::ffff: - so 23 bytes for that syntax.
		if (i == maxoff) {
			NNI_ASSERT(idx <= 43);
			strcat(buf + idx, "::");
			idx += 2;
			sep = false;
		} else if (i < maxoff || i >= maxoff + maxcnt) {
			// this takes at most six bytes -- four hax digits a
			// colon, and a null
			NNI_ASSERT(idx <= 40);
			snprintf(buf + idx, 6, sep ? ":%x" : "%x",
			    (((uint16_t) addr[i]) << 8) + addr[i + 1]);
			idx += strlen(buf + idx);
			sep = true;
		}
	}
	return (buf);
}